

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_2::checkOpenEXRFile
               (char *data,size_t numBytes,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  uint *puVar7;
  Header *pHVar8;
  bool reduceTime_00;
  bool reduceTime_01;
  bool reduceTime_02;
  undefined3 in_register_00000081;
  bool bVar9;
  bool bVar10;
  exr_context_t f;
  int maxTileHeight;
  int maxTileWidth;
  int maxImageHeight;
  int maxImageWidth;
  exr_context_initializer_t cinit;
  PtrIStream stream;
  exr_context_t local_118;
  size_t local_110;
  _priv_exr_context_t local_108;
  undefined7 uStack_107;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  code *pcStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined ***local_c8;
  code *pcStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  long local_78;
  undefined **local_70;
  size_t local_68;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (CONCAT31(in_register_00000081,runCoreCheck) == 0) {
    Imf_3_2::IStream::IStream((IStream *)&local_70,"none");
    local_70 = &PTR__IStream_001295f8;
    local_38 = data + numBytes;
    local_48 = data;
    local_40 = data;
    local_78 = Imf_3_2::CompositeDeepScanLine::getMaximumSampleCount();
    Imf_3_2::Header::getMaxImageSize(&local_ec,&local_f0);
    Imf_3_2::Header::getMaxImageSize(&local_f4,&local_f8);
    if (reduceMemory || reduceTime) {
      Imf_3_2::CompositeDeepScanLine::setMaximumSampleCount(0x100000);
      Imf_3_2::Header::setMaxImageSize(0x800,0x800);
      Imf_3_2::Header::setMaxTileSize(0x200,0x200);
    }
    local_118 = &local_108;
    local_110 = 0;
    local_108 = (_priv_exr_context_t)0x0;
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&local_e8,(IStream *)&local_70,iVar6,true);
    Imf_3_2::MultiPartInputFile::header((int)&local_e8);
    Imf_3_2::Header::type_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&local_118);
    cVar4 = Imf_3_2::isTiled((string *)&local_118);
    if (cVar4 == '\0') {
      bVar10 = false;
    }
    else {
      Imf_3_2::MultiPartInputFile::header((int)&local_e8);
      puVar7 = (uint *)Imf_3_2::Header::tileDescription();
      uVar1 = *puVar7;
      uVar2 = puVar7[1];
      pHVar8 = (Header *)Imf_3_2::MultiPartInputFile::header((int)&local_e8);
      iVar6 = Imf_3_2::calculateBytesPerPixel(pHVar8);
      bVar10 = 1000000 < (long)iVar6 * (ulong)uVar2 * (ulong)uVar1;
    }
    bVar3 = anon_unknown_0::readMultiPart((MultiPartInputFile *)&local_e8,reduceMemory,reduceTime);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&local_e8);
    if (!reduceMemory) {
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar5 = anon_unknown_0::readRgba((RgbaInputFile *)&local_e8,reduceTime,reduceTime_00);
      Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&local_e8);
      bVar9 = bVar3;
      if (((bVar5) && (bVar9 = true, local_110 == DAT_0012aa88)) && (bVar9 = bVar3, local_110 != 0))
      {
        iVar6 = bcmp(local_118,DEEPTILE_abi_cxx11_,local_110);
        bVar9 = true;
        if (iVar6 == 0) {
          bVar9 = bVar3;
        }
      }
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar5 = anon_unknown_0::readScanline<Imf_3_2::InputFile>
                        ((InputFile *)&local_e8,reduceTime,reduceTime_01);
      Imf_3_2::InputFile::~InputFile((InputFile *)&local_e8);
      bVar3 = bVar9;
      if (((bVar5) && (bVar3 = true, local_110 == DAT_0012aa88)) && (bVar3 = bVar9, local_110 != 0))
      {
        iVar6 = bcmp(local_118,DEEPTILE_abi_cxx11_,local_110);
        bVar3 = true;
        if (iVar6 == 0) {
          bVar3 = bVar9;
        }
      }
    }
    bVar9 = bVar3;
    if ((!reduceMemory) || (!bVar10)) {
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledInputFile::TiledInputFile
                ((TiledInputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar5 = anon_unknown_0::readTile<Imf_3_2::TiledInputFile>
                        ((TiledInputFile *)&local_e8,reduceMemory,reduceTime);
      Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&local_e8);
      if ((bVar5) && (local_110 == DAT_0012aa48)) {
        if (local_110 == 0) {
          bVar9 = true;
        }
        else {
          iVar6 = bcmp(local_118,TILEDIMAGE_abi_cxx11_,local_110);
          bVar9 = true;
          if (iVar6 != 0) {
            bVar9 = bVar3;
          }
        }
      }
    }
    bVar5 = bVar9;
    if (!reduceMemory) {
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
                ((DeepScanLineInputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar3 = anon_unknown_0::readDeepScanLine<Imf_3_2::DeepScanLineInputFile>
                        ((DeepScanLineInputFile *)&local_e8,reduceTime,reduceTime_02);
      Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&local_e8);
      if ((bVar3) && (local_110 == DAT_0012aa68)) {
        if (local_110 == 0) {
          bVar5 = true;
        }
        else {
          iVar6 = bcmp(local_118,DEEPSCANLINE_abi_cxx11_,local_110);
          bVar5 = true;
          if (iVar6 != 0) {
            bVar5 = bVar9;
          }
        }
      }
    }
    bVar3 = bVar5;
    if ((!reduceMemory) || (!bVar10)) {
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_2::globalThreadCount();
      Imf_3_2::DeepTiledInputFile::DeepTiledInputFile
                ((DeepTiledInputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar10 = anon_unknown_0::readDeepTile<Imf_3_2::DeepTiledInputFile>
                         ((DeepTiledInputFile *)&local_e8,reduceMemory,reduceTime);
      Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)&local_e8);
      if ((bVar10) && (local_110 == DAT_0012aa88)) {
        if (local_110 == 0) {
          bVar3 = true;
        }
        else {
          iVar6 = bcmp(local_118,DEEPTILE_abi_cxx11_,local_110);
          bVar3 = true;
          if (iVar6 != 0) {
            bVar3 = bVar5;
          }
        }
      }
    }
    Imf_3_2::CompositeDeepScanLine::setMaximumSampleCount(local_78);
    Imf_3_2::Header::setMaxImageSize(local_ec,local_f0);
    Imf_3_2::Header::setMaxTileSize(local_f4,local_f8);
    if (local_118 != &local_108) {
      operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
    }
    Imf_3_2::IStream::~IStream((IStream *)&local_70);
  }
  else {
    local_98 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    uStack_b0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_88 = 0;
    local_e8 = 0x68;
    uStack_90 = 0xbf800000fffffffe;
    local_c8 = &local_70;
    pcStack_c0 = anon_unknown_0::memstream_read;
    local_b8 = anon_unknown_0::memstream_size;
    pcStack_e0 = anon_unknown_0::core_error_handler_cb;
    local_70 = (undefined **)data;
    local_68 = numBytes;
    iVar6 = exr_start_read(&local_118,"<memstream>");
    bVar3 = true;
    if (iVar6 == 0) {
      bVar3 = anon_unknown_0::checkCoreFile(local_118,reduceMemory,reduceTime);
      exr_finish(&local_118);
    }
  }
  return bVar3;
}

Assistant:

bool
checkOpenEXRFile (
    const char* data,
    size_t      numBytes,
    bool        reduceMemory,
    bool        reduceTime,
    bool        runCoreCheck)
{


     if (runCoreCheck)
     {
        return runCoreChecks (data, numBytes, reduceMemory, reduceTime);
     }
     else
     {
        PtrIStream stream (data, numBytes);
        return runChecks (stream, reduceMemory, reduceTime);
    }


}